

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_freeallobjects(lua_State *L)

{
  global_State *g_00;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  g_00->gcstp = '\x04';
  luaC_changemode(L,0);
  separatetobefnz(g_00,1);
  callallpendingfinalizers(L);
  deletelist(L,g_00->allgc,(GCObject *)g_00->mainthread);
  deletelist(L,g_00->fixedgc,(GCObject *)0x0);
  return;
}

Assistant:

void luaC_freeallobjects (lua_State *L) {
  global_State *g = G(L);
  g->gcstp = GCSTPCLS;  /* no extra finalizers after here */
  luaC_changemode(L, KGC_INC);
  separatetobefnz(g, 1);  /* separate all objects with finalizers */
  lua_assert(g->finobj == NULL);
  callallpendingfinalizers(L);
  deletelist(L, g->allgc, obj2gco(g->mainthread));
  lua_assert(g->finobj == NULL);  /* no new finalizers */
  deletelist(L, g->fixedgc, NULL);  /* collect fixed objects */
  lua_assert(g->strt.nuse == 0);
}